

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODDXFilmEdgeReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::OneD::DXFilmEdgeReader::decodePattern
          (Barcode *__return_storage_ptr__,DXFilmEdgeReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *state)

{
  pointer *ppCVar1;
  pointer pCVar2;
  double dVar3;
  pointer pCVar4;
  pointer pCVar5;
  undefined3 uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  DXFEState *this_00;
  Clock *pCVar10;
  ulong uVar11;
  pointer pCVar12;
  pointer pCVar13;
  byte bVar14;
  int iVar15;
  Iterator puVar16;
  uint uVar17;
  Iterator extraout_RDX;
  Iterator puVar18;
  Iterator extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t __n;
  byte *pbVar19;
  Iterator puVar20;
  ushort *puVar21;
  PointI p;
  pointer this_01;
  pointer __old_p;
  ulong uVar22;
  float fVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  BitArray dataBits;
  string txt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  pointer local_d0;
  ulong local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  Error local_60;
  
  this_00 = (DXFEState *)
            (state->_M_t).
            super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
            ._M_t.
            super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
            .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl;
  if (this_00 == (DXFEState *)0x0) {
    this_00 = (DXFEState *)operator_new(0x28);
    (this_00->super_DecodingState)._vptr_DecodingState = (_func_int **)&PTR__DXFEState_0020a628;
    *(pointer *)((long)&this_00->clocks + 0x10) = (pointer)0x0;
    *(_func_int ***)
     &(this_00->clocks).
      super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
      ._M_impl = (_func_int **)0x0;
    *(pointer *)((long)&this_00->clocks + 8) = (pointer)0x0;
    (state->_M_t).
    super___uniq_ptr_impl<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    ._M_t.
    super__Tuple_impl<0UL,_ZXing::OneD::RowReader::DecodingState_*,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
    .super__Head_base<0UL,_ZXing::OneD::RowReader::DecodingState_*,_false>._M_head_impl =
         (DecodingState *)this_00;
    this_00->centerRow = rowNumber;
  }
  if (((undefined1  [12])((undefined1  [12])*(this->super_RowReader)._opts & (undefined1  [12])0x2)
       == (undefined1  [12])0x0) && (rowNumber < this_00->centerRow)) goto LAB_00173c00;
  iVar8 = next->_size;
  if (iVar8 < 10) {
    local_f8.field_2._M_allocated_capacity = 0;
    local_f8.field_2._8_8_ = (Iterator)0x0;
    local_f8._M_dataplus._M_p = (pointer)0x0;
    local_f8._M_string_length = 0;
  }
  else {
    puVar20 = next->_data;
    txt.field_2._M_allocated_capacity = (size_type)next->_base;
    txt.field_2._8_8_ = next->_end;
    txt._M_string_length = CONCAT44(txt._M_string_length._4_4_,4);
    puVar18 = (Iterator)(txt.field_2._M_allocated_capacity + 2);
    puVar16 = puVar20;
    txt._M_dataplus._M_p = (pointer)puVar20;
    if (puVar20 == puVar18) {
      bVar7 = decodePattern::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&txt,(PatternView *)0x7fffffff,(int)puVar18);
      if (!bVar7) {
        puVar16 = next->_data;
        iVar8 = next->_size;
        puVar18 = extraout_RDX;
        goto LAB_001738ac;
      }
LAB_00173893:
      local_f8.field_2._M_allocated_capacity = txt.field_2._M_allocated_capacity;
      local_f8.field_2._8_8_ = txt.field_2._8_8_;
      local_f8._M_dataplus._M_p._0_4_ = txt._M_dataplus._M_p._0_4_;
      local_f8._M_dataplus._M_p._4_4_ = txt._M_dataplus._M_p._4_4_;
      uVar24 = (undefined4)txt._M_string_length;
      uVar25 = txt._M_string_length._4_4_;
    }
    else {
LAB_001738ac:
      while (puVar20 < puVar16 + (long)iVar8 + -10) {
        bVar7 = decodePattern::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&txt,(PatternView *)(ulong)puVar20[-1],
                           (int)puVar18);
        if (bVar7) goto LAB_00173893;
        puVar20 = puVar20 + 2;
        puVar18 = extraout_RDX_00;
        txt._M_dataplus._M_p = (pointer)puVar20;
      }
      local_f8._M_dataplus._M_p._0_4_ = 0;
      local_f8._M_dataplus._M_p._4_4_ = 0;
      uVar24 = 0;
      uVar25 = 0;
      local_f8.field_2._M_allocated_capacity = 0;
      local_f8.field_2._8_8_ = (Iterator)0x0;
    }
    local_f8._M_string_length = CONCAT44(uVar25,uVar24);
  }
  next->_base = (Iterator)local_f8.field_2._M_allocated_capacity;
  next->_end = (Iterator)local_f8.field_2._8_8_;
  next->_data = (Iterator)local_f8._M_dataplus._M_p;
  *(size_type *)&next->_size = local_f8._M_string_length;
  bVar7 = PatternView::isValid(next);
  if (!bVar7) goto LAB_00173c00;
  next->_size = 0x19;
  bVar7 = PatternView::isValid(next);
  if (bVar7) {
    if (next->_data == next->_base + 1) {
      uVar17 = 0x7fffffff;
    }
    else {
      uVar17 = (uint)next->_data[-1];
    }
    dVar3 = IsPattern<false,25,31>
                      (next,(FixedPattern<25,_31,_false> *)(anonymous_namespace)::CLOCK_PATTERN_FN,
                       uVar17,0.5,0.0);
    bVar7 = true;
    if ((dVar3 == 0.0) && (!NAN(dVar3))) goto LAB_00173970;
LAB_001739cb:
    iVar8 = PatternView::pixelsInFront(next);
    iVar9 = PatternView::pixelsTillEnd(next);
    pCVar10 = anon_unknown_0::DXFEState::findClock(this_00,iVar8,rowNumber);
    if (pCVar10 == (Clock *)0x0) {
      pCVar2 = *(pointer *)
                ((long)&(this_00->clocks).
                        super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
                + 8);
      if (pCVar2 == *(pointer *)
                     ((long)&(this_00->clocks).
                             super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
                     + 0x10)) {
        this_01 = (this_00->clocks).
                  super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((long)pCVar2 - (long)this_01 == 0x7ffffffffffffff0) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar22 = (long)pCVar2 - (long)this_01 >> 4;
        uVar11 = 1;
        if (pCVar2 != this_01) {
          uVar11 = uVar22;
        }
        local_c8 = uVar11 + uVar22;
        if (0x7fffffffffffffe < local_c8) {
          local_c8 = 0x7ffffffffffffff;
        }
        if (CARRY8(uVar11,uVar22)) {
          local_c8 = 0x7ffffffffffffff;
        }
        if (local_c8 == 0) {
          pCVar12 = (pointer)0x0;
          __n = 0;
        }
        else {
          local_d0 = this_01;
          pCVar12 = (pointer)operator_new(local_c8 << 4);
          __n = extraout_RDX_01;
          this_01 = local_d0;
        }
        pCVar12[uVar22].hasFrameNr = bVar7;
        pCVar12[uVar22].rowNumber = rowNumber;
        pCVar12[uVar22].xStart = iVar8;
        pCVar12[uVar22].xStop = iVar9;
        pCVar4 = pCVar12;
        for (pCVar13 = this_01; pCVar13 != pCVar2; pCVar13 = pCVar13 + 1) {
          uVar6 = *(undefined3 *)&pCVar13->field_0x1;
          iVar8 = pCVar13->rowNumber;
          pCVar5 = *(pointer *)&pCVar13->xStart;
          pCVar4->hasFrameNr = pCVar13->hasFrameNr;
          *(undefined3 *)&pCVar4->field_0x1 = uVar6;
          pCVar4->rowNumber = iVar8;
          *(pointer *)&pCVar4->xStart = pCVar5;
          pCVar4 = pCVar4 + 1;
        }
        std::
        _Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
        ::_M_deallocate((_Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
                         *)this_01,
                        (pointer)((long)*(pointer *)
                                         ((long)&(this_00->clocks).
                                                 super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
                                         + 0x10) - (long)this_01 >> 4),__n);
        (this_00->clocks).
        super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
        ._M_impl.super__Vector_impl_data._M_start = pCVar12;
        *(pointer *)
         ((long)&(this_00->clocks).
                 super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
         + 8) = pCVar4 + 1;
        *(pointer *)
         ((long)&(this_00->clocks).
                 super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
         + 0x10) = pCVar12 + local_c8;
      }
      else {
        *(bool *)&((_Vector_impl *)&pCVar2->hasFrameNr)->super__Vector_impl_data = bVar7;
        pCVar2->rowNumber = rowNumber;
        pCVar2->xStart = iVar8;
        pCVar2->xStop = iVar9;
        ppCVar1 = (pointer *)
                  ((long)&(this_00->clocks).
                          super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
                  + 8);
        *ppCVar1 = *ppCVar1 + 1;
      }
    }
    else {
      pCVar10->hasFrameNr = bVar7;
      pCVar10->rowNumber = rowNumber;
      pCVar10->xStart = iVar8;
      pCVar10->xStop = iVar9;
    }
    if (next->_data != (Iterator)0x0) {
      next->_data = next->_data + next->_size;
    }
LAB_00173c00:
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
LAB_00173970:
  next->_size = 0x11;
  bVar7 = PatternView::isValid(next);
  if (bVar7) {
    if (next->_data == next->_base + 1) {
      uVar17 = 0x7fffffff;
    }
    else {
      uVar17 = (uint)next->_data[-1];
    }
    dVar3 = IsPattern<false,17,23>
                      (next,(FixedPattern<17,_23,_false> *)
                            (anonymous_namespace)::CLOCK_PATTERN_NO_FN,uVar17,2.0,0.0);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      bVar7 = false;
      goto LAB_001739cb;
    }
  }
  if ((this_00->clocks).
      super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      *(pointer *)
       ((long)&(this_00->clocks).
               super__Vector_base<ZXing::OneD::(anonymous_namespace)::Clock,_std::allocator<ZXing::OneD::(anonymous_namespace)::Clock>_>
       + 8)) goto LAB_00173c00;
  next->_size = 5;
  bVar7 = PatternView::isValid(next);
  if (!bVar7) goto LAB_00173c00;
  if (next->_data == next->_base + 1) {
    uVar17 = 0x7fffffff;
  }
  else {
    uVar17 = (uint)next->_data[-1];
  }
  dVar3 = IsPattern<false,5,5>
                    (next,(FixedPattern<5,_5,_false> *)(anonymous_namespace)::DATA_START_PATTERN,
                     uVar17,0.5,0.0);
  if ((dVar3 == 0.0) && (!NAN(dVar3))) goto LAB_00173c00;
  iVar8 = PatternView::pixelsInFront(next);
  pCVar10 = anon_unknown_0::DXFEState::findClock(this_00,iVar8,rowNumber);
  if (pCVar10 == (Clock *)0x0) goto LAB_00173c00;
  if (next->_data == (Iterator)0x0) {
    puVar21 = (ushort *)0x0;
  }
  else {
    puVar21 = next->_data + next->_size;
    next->_data = puVar21;
  }
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    iVar15 = (int)dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
             (int)dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    iVar9 = (pCVar10->hasFrameNr & 1) * 8 + 0xf;
    if ((((puVar21 == (ushort *)0x0) || (puVar21 < next->_base)) || (next->_end < puVar21 + 1)) ||
       (iVar9 <= iVar15)) break;
    fVar23 = 31.0;
    if ((pCVar10->hasFrameNr & 1U) == 0) {
      fVar23 = 23.0;
    }
    BitArray::appendBits
              (&dataBits,((int)puVar21 - (int)next->_base) * 0x40000000 >> 0x1f,
               (int)((float)*puVar21 / ((float)(pCVar10->xStop - pCVar10->xStart) / fVar23) + 0.5));
    if (next->_data == (Iterator)0x0) {
      puVar21 = (ushort *)0x0;
    }
    else {
      puVar21 = next->_data + 1;
      next->_data = puVar21;
    }
  }
  if (iVar9 == iVar15) {
    next->_size = 3;
    bVar7 = PatternView::isValid(next);
    if (((bVar7) &&
        (bVar7 = IsRightGuard<3,3,false>
                           (next,(FixedPattern<3,_3,_false> *)
                                 &(anonymous_namespace)::DATA_STOP_PATTERN,0.5,0.0), bVar7)) &&
       ((bVar7 = BitArray::get(&dataBits,0), !bVar7 && (bVar7 = BitArray::get(&dataBits,8), !bVar7))
       )) {
      if (pCVar10->hasFrameNr == true) {
        bVar7 = BitArray::get(&dataBits,0x14);
        if (bVar7) goto LAB_00173d84;
        bVar7 = BitArray::get(&dataBits,0x16);
      }
      else {
        bVar7 = BitArray::get(&dataBits,0xe);
      }
      if (bVar7 == false) {
        bVar14 = 0;
        for (pbVar19 = dataBits._bits.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pbVar19 !=
            dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish + -2; pbVar19 = pbVar19 + 1) {
          bVar14 = bVar14 + *pbVar19;
        }
        if ((bVar14 & 1) ==
            dataBits._bits.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_finish[-2]) {
          iVar9 = ToInt<int,void>(&dataBits,1,7);
          if (iVar9 == 0) {
            memset(__return_storage_ptr__,0,0xd8);
            Result::Result(__return_storage_ptr__);
          }
          else {
            iVar15 = ToInt<int,void>(&dataBits,9,4);
            txt._M_dataplus._M_p = (pointer)&txt.field_2;
            txt._M_string_length = 0;
            txt.field_2._M_allocated_capacity =
                 txt.field_2._M_allocated_capacity & 0xffffffffffffff00;
            std::__cxx11::string::reserve((ulong)&txt);
            std::__cxx11::to_string(&local_80,iVar9);
            std::operator+(&local_c0,&local_80,"-");
            std::__cxx11::to_string(&local_a0,iVar15);
            std::operator+(&local_f8,&local_c0,&local_a0);
            std::__cxx11::string::operator=((string *)&txt,(string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_a0);
            std::__cxx11::string::~string((string *)&local_c0);
            std::__cxx11::string::~string((string *)&local_80);
            if (pCVar10->hasFrameNr == true) {
              iVar9 = ToInt<int,void>(&dataBits,0xd,6);
              std::__cxx11::to_string(&local_c0,iVar9);
              std::operator+(&local_f8,"/",&local_c0);
              std::__cxx11::string::append((string *)&txt);
              std::__cxx11::string::~string((string *)&local_f8);
              std::__cxx11::string::~string((string *)&local_c0);
              bVar7 = BitArray::get(&dataBits,0x13);
              if (bVar7) {
                std::__cxx11::string::append((char *)&txt);
              }
            }
            iVar9 = PatternView::pixelsTillEnd(next);
            p.y = rowNumber;
            p.x = iVar9;
            bVar7 = anon_unknown_0::Clock::isCloseTo(pCVar10,p,pCVar10->xStop);
            if (bVar7) {
              pCVar10->xStart = iVar8;
              pCVar10->xStop = iVar9;
              local_60._msg._M_dataplus._M_p = (pointer)&local_60._msg.field_2;
              local_60._msg.field_2._M_allocated_capacity = 0;
              local_60._msg.field_2._8_8_ = 0;
              local_60._msg._M_string_length = 0;
              local_60._file = (char *)0x0;
              local_60._line = -1;
              local_60._type = None;
              local_60._43_5_ = 0;
              Result::Result(__return_storage_ptr__,&txt,rowNumber,iVar8,iVar9,DXFilmEdge,
                             (SymbologyIdentifier)0x0,&local_60,false);
              std::__cxx11::string::~string((string *)&local_60);
            }
            else {
              memset(__return_storage_ptr__,0,0xd8);
              Result::Result(__return_storage_ptr__);
            }
            std::__cxx11::string::~string((string *)&txt);
          }
        }
        else {
          memset(__return_storage_ptr__,0,0xd8);
          Result::Result(__return_storage_ptr__);
        }
        goto LAB_00173d9b;
      }
    }
  }
LAB_00173d84:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_00173d9b:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&dataBits);
  return __return_storage_ptr__;
}

Assistant:

Barcode DXFilmEdgeReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>& state) const
{
	if (!state) {
		state.reset(new DXFEState);
		static_cast<DXFEState*>(state.get())->centerRow = rowNumber;
	}

	auto dxState = static_cast<DXFEState*>(state.get());

	// Only consider rows below the center row of the image
	if (!_opts.tryRotate() && rowNumber < dxState->centerRow)
		return {};

	// Look for a pattern that is part of both the clock as well as the data track (ommitting the first bar)
	constexpr auto Is4x1 = [](const PatternView& view, int spaceInPixel) {
		// find min/max of 4 consecutive bars/spaces and make sure they are close together
		auto [m, M] = std::minmax({view[1], view[2], view[3], view[4]});
		return M <= m * 4 / 3 + 1 && spaceInPixel > m / 2;
	};

	// 12 is the minimum size of the data track (at least one product class bit + one parity bit)
	next = FindLeftGuard<4>(next, 10, Is4x1);
	if (!next.isValid())
		return {};

	// Check if the 4x1 pattern is part of a clock track
	if (auto clock = CheckForClock(rowNumber, next)) {
		dxState->addClock(*clock);
		next.skipSymbol();
		return {};
	}

	// Without at least one clock track, we stop here
	if (dxState->clocks.empty())
		return {};

	constexpr float minDataQuietZone = 0.5;

	if (!IsPattern(next, DATA_START_PATTERN, minDataQuietZone))
		return {};

	auto xStart = next.pixelsInFront();

	// Only consider data tracks that are next to a clock track
	auto clock = dxState->findClock(xStart, rowNumber);
	if (!clock)
		return {};

	// Skip the data start pattern (black, white, black, white, black)
	// The first signal bar is always white: this is the
	// separation between the start pattern and the product number
	next.skipSymbol();

	// Read the data bits
	BitArray dataBits;
	while (next.isValid(1) && dataBits.size() < clock->dataLength()) {

		int modules = int(next[0] / clock->moduleSize() + 0.5);
		// even index means we are at a bar, otherwise at a space
		dataBits.appendBits(next.index() % 2 == 0 ? 0xFFFFFFFF : 0x0, modules);

		next.shift(1);
	}

	// Check the data track length
	if (dataBits.size() != clock->dataLength())
		return {};

	next = next.subView(0, DATA_STOP_PATTERN.size());

	// Check there is the Stop pattern at the end of the data track
	if (!next.isValid() || !IsRightGuard(next, DATA_STOP_PATTERN, minDataQuietZone))
		return {};

	// The following bits are always white (=false), they are separators.
	if (dataBits.get(0) || dataBits.get(8) || (clock->hasFrameNr ? (dataBits.get(20) || dataBits.get(22)) : dataBits.get(14)))
		return {};

	// Check the parity bit
	auto signalSum = Reduce(dataBits.begin(), dataBits.end() - 2, 0);
	auto parityBit = *(dataBits.end() - 2);
	if (signalSum % 2 != (int)parityBit)
		return {};

	// Compute the DX 1 number (product number)
	auto productNumber = ToInt(dataBits, 1, 7);
	if (!productNumber)
		return {};

	// Compute the DX 2 number (generation number)
	auto generationNumber = ToInt(dataBits, 9, 4);

	// Generate the textual representation.
	// Eg: 115-10/11A means: DX1 = 115, DX2 = 10, Frame number = 11A
	std::string txt;
	txt.reserve(10);
	txt = std::to_string(productNumber) + "-" + std::to_string(generationNumber);
	if (clock->hasFrameNr) {
		auto frameNr = ToInt(dataBits, 13, 6);
		txt += "/" + std::to_string(frameNr);
		if (dataBits.get(19))
			txt += "A";
	}

	auto xStop = next.pixelsTillEnd();

	// The found data track must end near the clock track
	if (!clock->isCloseToStop(xStop, rowNumber))
		return {};

	// Update the clock coordinates with the latest corresponding data track
	// This may improve signal detection for next row iterations
	clock->xStart = xStart;
	clock->xStop = xStop;

	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::DXFilmEdge, {});
}